

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_server.cpp
# Opt level: O0

void ConnectFunc(Handle *handle,uint32_t err)

{
  int iVar1;
  element_type *peVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  void *pvVar4;
  uint32_t err_local;
  Handle *handle_local;
  
  if (err == 0) {
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    iVar1 = (*peVar2->_vptr_CNSocket[3])();
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(ushort)iVar1);
    poVar3 = std::operator<<(poVar3," port get connect socket: ");
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    iVar1 = (*peVar2->_vptr_CNSocket[2])();
    pvVar4 = (void *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var,iVar1));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ConnectFunc] some thing error : ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,err);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ConnectFunc(Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        std::cout << handle->GetListenPort() << " port get connect socket: " << handle->GetSocket() << std::endl;

    } else {
        std::cout << "[ConnectFunc] some thing error : " << err << std::endl;
    }
}